

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFBcc<(moira::Instr)188,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  i32 iVar2;
  StrWriter *pSVar3;
  UInt local_44;
  int local_40;
  Fcc local_3c [2];
  u32 local_34;
  byte local_2d;
  u32 dst;
  u32 uStack_28;
  u8 cnd;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  dst = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 0x1f;
  if (((ext._2_2_ & 0x7f) == 0) && (dst == 0)) {
    dasmFNop<(moira::Instr)196,(moira::Mode)12,2>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  else {
    iVar1 = uStack_28 + 2;
    local_34 = iVar1;
    iVar2 = SEXT<2>((ulong)dst);
    local_34 = iVar1 + iVar2;
    pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
    Fcc::Fcc(local_3c,(uint)local_2d);
    pSVar3 = StrWriter::operator<<(pSVar3,local_3c[0]);
    local_40 = addr_local[0xe];
    pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_40);
    UInt::UInt(&local_44,local_34);
    StrWriter::operator<<(pSVar3,local_44);
  }
  return;
}

Assistant:

void
Moira::dasmFBcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<S>(addr);
    auto cnd = ___________xxxxx (op);

    // Check for special FNOP opcode
    if ((op & 0x7F) == 0 && ext == 0) {

        dasmFNop<Instr::FNOP, M, S>(str, addr, op);
        return;
    }

    auto dst = old + 2;
    U32_INC(dst, SEXT<S>(ext));

    if (S == Long) {
        str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << UInt(dst);
    } else {
        str << Ins<I>{} << Fcc{cnd} << str.tab << UInt(dst);
    }
}